

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.hpp
# Opt level: O0

void __thiscall EOClient::EOClient(EOClient *this,Socket *sock,EOServer *server_)

{
  EOServer *server__local;
  Socket *sock_local;
  EOClient *this_local;
  
  Client::Client(&this->super_Client,sock,&server_->super_Server);
  (this->super_Client)._vptr_Client = (_func_int **)&PTR_NeedTick_002c5528;
  std::__cxx11::string::string((string *)&this->send_buffer2);
  this->start = 0.0;
  this->next_eif_id = 1;
  this->next_enf_id = 1;
  this->next_esf_id = 1;
  this->next_ecf_id = 1;
  ActionQueue::ActionQueue(&this->queue);
  std::__cxx11::string::string((string *)&this->data);
  PacketProcessor::PacketProcessor(&this->processor);
  Initialize(this);
  return;
}

Assistant:

EOClient(const Socket &sock, EOServer *server_) : Client(sock, server_)
		{
			this->Initialize();
		}